

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroProp.cpp
# Opt level: O2

RealType __thiscall OpenMD::HydroProp::getScalarPitch(HydroProp *this)

{
  int i;
  long lVar1;
  double dVar2;
  RealType RVar3;
  Vector3d evals;
  Mat3x3d evects;
  Mat3x3d P;
  Vector<double,_3U> local_c0;
  SquareMatrix<double,_3> local_a8;
  Mat3x3d local_60;
  
  getPitchMatrix(&local_60,this);
  Vector<double,_3U>::Vector(&local_c0);
  SquareMatrix<double,_3>::SquareMatrix(&local_a8);
  SquareMatrix3<double>::diagonalize
            (&local_60,(Vector3<double> *)&local_c0,(SquareMatrix3<double> *)&local_a8);
  dVar2 = 0.0;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    dVar2 = dVar2 + local_c0.data_[lVar1] * local_c0.data_[lVar1];
  }
  dVar2 = dVar2 / 3.0;
  if (dVar2 < 0.0) {
    RVar3 = sqrt(dVar2);
  }
  else {
    RVar3 = SQRT(dVar2);
  }
  return RVar3;
}

Assistant:

RealType HydroProp::getScalarPitch() {
    Mat3x3d P = getPitchMatrix();
    Vector3d evals;
    Mat3x3d evects;
    Mat3x3d::diagonalize(P, evals, evects);
    RealType pScalar(0.0);

    for (int i = 0; i < 3; i++) {
      pScalar += pow(evals[i], 2);
    }
    pScalar /= 3.0;

    return sqrt(pScalar);
  }